

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O1

_Bool fiber_alloc(Fiber *fbr,size_t size,FiberCleanupFunc cleanup,void *arg,FiberFlags flags)

{
  _Bool _Var1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  ushort uVar5;
  short sVar6;
  ulong uVar7;
  long lVar8;
  FiberGuardArgs *args;
  undefined8 *local_38;
  
  fbr->stack_size = size;
  uVar5 = flags & 0x18;
  if (uVar5 == 0) {
    pvVar4 = malloc(size);
    fbr->stack = pvVar4;
    fbr->alloc_stack = pvVar4;
    if (pvVar4 != (void *)0x0) {
LAB_00101411:
      fbr->state = uVar5;
      (fbr->regs).sp = (void *)0x0;
      (fbr->regs).lr = (void *)0x0;
      (fbr->regs).rbp = (void *)0x0;
      (fbr->regs).rbx = (void *)0x0;
      (fbr->regs).r12 = (void *)0x0;
      (fbr->regs).r13 = (void *)0x0;
      (fbr->regs).r14 = (void *)0x0;
      (fbr->regs).r15 = (void *)0x0;
      (fbr->regs).sp = (void *)((long)fbr->stack + (fbr->stack_size - 8) & 0xfffffffffffffff0);
      fiber_reserve_return(fbr,fiber_guard,&local_38,0x18);
      *local_38 = fbr;
      local_38[1] = cleanup;
      local_38[2] = arg;
      *(byte *)&fbr->state = (byte)fbr->state | 4;
      return true;
    }
  }
  else {
    if (get_page_size_PAGE_SIZE == 0) {
      get_page_size_PAGE_SIZE = sysconf(0x1e);
    }
    uVar7 = get_page_size_PAGE_SIZE;
    uVar3 = (get_page_size_PAGE_SIZE + size) - 1;
    lVar8 = (((ulong)((flags & 8) >> 3) + 1) - (ulong)(uVar5 < 0x10)) +
            uVar3 / get_page_size_PAGE_SIZE;
    pvVar4 = (void *)memalign(get_page_size_PAGE_SIZE,lVar8 * get_page_size_PAGE_SIZE,
                              uVar3 % get_page_size_PAGE_SIZE);
    fbr->alloc_stack = pvVar4;
    if (pvVar4 == (void *)0x0) {
      iVar2 = 1;
    }
    else {
      sVar6 = (short)(flags & 8);
      if (((sVar6 == 0) || (_Var1 = protect_page(pvVar4,false), _Var1)) &&
         ((uVar5 < 0x10 ||
          (_Var1 = protect_page((void *)((lVar8 + -1) * uVar7 + (long)fbr->alloc_stack),false),
          _Var1)))) {
        iVar2 = 0;
        if (sVar6 == 0) {
          uVar7 = 0;
        }
        fbr->stack = (void *)(uVar7 + (long)fbr->alloc_stack);
      }
      else {
        iVar2 = 2;
      }
    }
    if (iVar2 == 2) {
      free(fbr->alloc_stack);
    }
    else if (iVar2 == 0) goto LAB_00101411;
  }
  return false;
}

Assistant:

bool
fiber_alloc(Fiber *fbr,
            size_t size,
            FiberCleanupFunc cleanup,
            void *arg,
            FiberFlags flags)
{
    NULL_CHECK(fbr, "Fiber cannot be NULL");
    flags &= FIBER_FLAG_GUARD_LO | FIBER_FLAG_GUARD_HI;
    fbr->stack_size = size;
    const size_t stack_size = size;

    if (!flags) {
        fbr->alloc_stack = fbr->stack = malloc(stack_size);
        if (!fbr->alloc_stack)
            return false;
    } else {
        size_t pgsz = get_page_size();
        size_t npages = (size + pgsz - 1) / pgsz;
        if (flags & FIBER_FLAG_GUARD_LO)
            ++npages;
        if (flags & FIBER_FLAG_GUARD_HI)
            ++npages;
        fbr->alloc_stack = alloc_aligned_chunks(npages, pgsz);
        if (hu_unlikely(!fbr->alloc_stack))
            return false;

        if (flags & FIBER_FLAG_GUARD_LO)
            if (hu_unlikely(!protect_page(fbr->alloc_stack, false)))
                goto fail;

        if (flags & FIBER_FLAG_GUARD_HI)
            if (hu_unlikely(!protect_page(
                  (char *) fbr->alloc_stack + (npages - 1) * pgsz, false)))
                goto fail;
        if (flags & FIBER_FLAG_GUARD_LO)
            fbr->stack = (char *) fbr->alloc_stack + pgsz;
        else
            fbr->stack = fbr->alloc_stack;
    }

    fbr->state = flags;
    fiber_init_(fbr, cleanup, arg);
    return true;

fail:
    free_pages(fbr->alloc_stack);
    return false;
}